

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImStb::is_word_boundary_from_right(ImGuiInputTextState *obj,int idx)

{
  bool bVar1;
  byte bVar2;
  int in_ESI;
  int in_stack_ffffffffffffffec;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 1) {
    uVar3 = 1;
  }
  else {
    ImVector<unsigned_short>::operator[]
              ((ImVector<unsigned_short> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffec);
    bVar1 = is_separator(0);
    bVar2 = 0;
    if (bVar1) {
      ImVector<unsigned_short>::operator[]
                ((ImVector<unsigned_short> *)
                 (CONCAT44(in_ESI,in_stack_fffffffffffffff0) & 0xffffffff00ffffff),
                 in_stack_ffffffffffffffec);
      bVar1 = is_separator(0);
      bVar2 = bVar1 ^ 0xff;
    }
    uVar3 = (uint)(bVar2 & 1);
  }
  return uVar3;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator(obj->TextW[idx - 1]) && !is_separator(obj->TextW[idx]) ) : 1; }